

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O3

int __thiscall
jrtplib::RTPUDPv6Transmitter::GetLocalHostName
          (RTPUDPv6Transmitter *this,uint8_t *buffer,size_t *bufferlength)

{
  _List_node_base *p_Var1;
  RTPMemoryManager *pRVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  size_type sVar8;
  bool bVar9;
  int iVar10;
  int iVar11;
  hostent *phVar12;
  _Node *p_Var13;
  long lVar14;
  size_t sVar15;
  uint8_t *puVar16;
  _Self __tmp;
  _List_node_base *p_Var17;
  ulong uVar18;
  undefined1 *puVar19;
  _Alloc_hider _Var20;
  bool bVar21;
  undefined1 auVar22 [16];
  uint uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  allocator<char> local_f9;
  _List_node_base local_f8;
  ulong *local_e8;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hostnames;
  string hname_1;
  string hname;
  in6_addr ip;
  
  iVar10 = -0x72;
  if ((this->init == true) && (iVar10 = -0x71, this->created == true)) {
    if (this->localhostname == (uint8_t *)0x0) {
      p_Var17 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl.
                _M_node.super__List_node_base._M_next;
      if (p_Var17 == (_List_node_base *)&this->localIPs) {
        return -0x6d;
      }
      hostnames.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      local_e8 = bufferlength;
      hostnames.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&hostnames;
      hostnames.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&hostnames;
      do {
        bVar21 = false;
LAB_00123c80:
        ip.__in6_u._0_8_ = p_Var17[1]._M_next;
        ip.__in6_u._8_8_ = p_Var17[1]._M_prev;
        phVar12 = gethostbyaddr(&ip,0x10,10);
        if (phVar12 != (hostent *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&hname,phVar12->h_name,(allocator<char> *)&hname_1);
          sVar8 = hname._M_string_length;
          _Var20 = hname._M_dataplus;
          p_Var1 = (_List_node_base *)&hostnames;
          while (!bVar21) {
            p_Var1 = p_Var1->_M_next;
            if (p_Var1 == (_List_node_base *)&hostnames) {
              p_Var13 = std::__cxx11::
                        list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                        _M_create_node<std::__cxx11::string_const&>
                                  ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                    *)&hostnames,&hname);
              std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
              hostnames.
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size =
                   hostnames.
                   super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl._M_node._M_size + 1;
              break;
            }
            if ((p_Var1[1]._M_prev == (_List_node_base *)sVar8) &&
               ((bVar9 = true, sVar8 == 0 ||
                (iVar10 = bcmp(p_Var1[1]._M_next,_Var20._M_p,sVar8), iVar10 == 0))))
            goto LAB_00123d35;
          }
          bVar9 = bVar21;
          if (!bVar21) {
            iVar10 = 0;
            goto LAB_00123d7a;
          }
          goto LAB_00123d35;
        }
LAB_00123e49:
        p_Var17 = p_Var17->_M_next;
      } while (p_Var17 != (_List_node_base *)&this->localIPs);
      if (hostnames.
          super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)&hostnames) {
        std::__cxx11::
        list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::sort(&hostnames);
        for (p_Var17 = hostnames.
                       super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next;
            p_Var17 != (_List_node_base *)&hostnames;
            p_Var17 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
          lVar14 = std::__cxx11::string::find((char)(p_Var17 + 1),0x2e);
          if (lVar14 != -1) {
            p_Var1 = p_Var17[1]._M_prev;
            this->localhostnamelength = (size_t)p_Var1;
            puVar19 = (undefined1 *)((long)&p_Var1->_M_next + 1);
            pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
            if (pRVar2 == (RTPMemoryManager *)0x0) {
              puVar16 = (uint8_t *)operator_new__((ulong)puVar19);
              this->localhostname = puVar16;
            }
            else {
              puVar16 = (uint8_t *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,puVar19,0);
              this->localhostname = puVar16;
              if (puVar16 == (uint8_t *)0x0) goto LAB_00124041;
            }
            memcpy(puVar16,p_Var17[1]._M_next,this->localhostnamelength);
            this->localhostname[this->localhostnamelength] = '\0';
            bufferlength = local_e8;
            goto LAB_0012408b;
          }
        }
      }
      local_f8 = (this->localIPs).super__List_base<in6_addr,_std::allocator<in6_addr>_>._M_impl.
                 _M_node.super__List_node_base._M_next[1];
      auVar24 = psllw(ZEXT116(local_f8._M_next._2_1_),8);
      uVar23 = local_f8._M_next._4_4_ << 0x10;
      auVar25._4_4_ = local_f8._M_prev._0_4_;
      auVar25._0_4_ = local_f8._M_prev._0_4_;
      auVar25._8_8_ = 0;
      auVar22 = ZEXT116(0) << 0x38 |
                (~_DAT_001318d0 & ZEXT816(0) |
                (~_DAT_001318c0 & ZEXT116(local_f8._M_prev._2_1_) << 0x28 |
                (~_DAT_001318b0 & auVar25 |
                (~_DAT_001318a0 & ZEXT116(local_f8._M_next._6_1_) << 0x18 |
                (~_DAT_00131890 & ZEXT416(uVar23) |
                (~_DAT_00131880 & auVar24 | (undefined1  [16])local_f8 & _DAT_00131880) &
                _DAT_00131890) & _DAT_001318a0) & _DAT_001318b0) & _DAT_001318c0) & _DAT_001318d0) &
                _DAT_001318e0;
      auVar5[10] = 0;
      auVar5._0_10_ = SUB1610((undefined1  [16])0x0,0);
      auVar5[0xb] = auVar22[5];
      auVar6[9] = auVar22[4];
      auVar6._0_9_ = SUB169((undefined1  [16])0x0,0);
      auVar6._10_2_ = auVar5._10_2_;
      auVar7._9_3_ = auVar6._9_3_;
      auVar7._0_9_ = (unkuint9)0;
      auVar4._1_10_ = SUB1610(ZEXT516(CONCAT41(auVar7._8_4_,auVar22[3])) << 0x38,6);
      auVar4[0] = auVar22[2];
      auVar4._11_5_ = 0;
      auVar3._1_12_ = SUB1612(auVar4 << 0x28,4);
      auVar3[0] = auVar22[1];
      auVar3._13_3_ = 0;
      auVar24._1_14_ = SUB1614(auVar3 << 0x18,2);
      auVar24[0] = auVar22[0];
      auVar24[0xf] = 0;
      auVar22._0_2_ = (ushort)local_f8._M_next >> 8;
      auVar22._2_2_ = local_f8._M_next._2_2_ >> 8;
      auVar22._4_2_ = local_f8._M_next._4_2_ >> 8;
      auVar22._6_2_ = local_f8._M_next._6_2_ >> 8;
      auVar22._8_2_ = (ushort)local_f8._M_prev >> 8;
      auVar22._10_2_ = local_f8._M_prev._2_2_ >> 8;
      auVar22._12_2_ = local_f8._M_prev._4_2_ >> 8;
      auVar22._14_2_ = local_f8._M_prev._6_2_ >> 8;
      auVar22 = auVar22 | auVar24 << 8;
      snprintf((char *)&hname,0x30,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",(ulong)auVar22._0_2_,
               (ulong)auVar22._2_2_,(ulong)auVar22._4_2_,(ulong)auVar22._6_2_,(ulong)auVar22._8_2_,
               (ulong)auVar22._10_2_,(ulong)auVar22._12_2_,(ulong)auVar22._14_2_);
      sVar15 = strlen((char *)&hname);
      this->localhostnamelength = (long)(int)sVar15;
      uVar18 = (long)(int)sVar15 + 1;
      pRVar2 = (this->super_RTPTransmitter).super_RTPMemoryObject.mgr;
      if (pRVar2 == (RTPMemoryManager *)0x0) {
        puVar16 = (uint8_t *)operator_new__(uVar18);
        this->localhostname = puVar16;
      }
      else {
        puVar16 = (uint8_t *)(**(code **)(*(long *)pRVar2 + 0x10))(pRVar2,uVar18,0);
        this->localhostname = puVar16;
        if (puVar16 == (uint8_t *)0x0) {
LAB_00124041:
          std::__cxx11::
          _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_clear(&hostnames.
                      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    );
          return -1;
        }
      }
      bufferlength = local_e8;
      memcpy(puVar16,&hname,this->localhostnamelength);
      this->localhostname[this->localhostnamelength] = '\0';
LAB_0012408b:
      std::__cxx11::
      _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_clear(&hostnames.
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                );
    }
    uVar18 = this->localhostnamelength;
    if (*bufferlength < uVar18) {
      *bufferlength = uVar18;
      iVar10 = -0x45;
    }
    else {
      memcpy(buffer,this->localhostname,uVar18);
      *bufferlength = this->localhostnamelength;
      iVar10 = 0;
    }
  }
  return iVar10;
LAB_00123d7a:
  do {
    bVar9 = bVar21;
    if (phVar12->h_aliases[iVar10] == (char *)0x0) break;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&hname_1,phVar12->h_aliases[iVar10],&local_f9);
    sVar8 = hname_1._M_string_length;
    _Var20 = hname_1._M_dataplus;
    p_Var1 = hostnames.
             super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (!bVar21) {
      for (; p_Var1 != (_List_node_base *)&hostnames; p_Var1 = p_Var1->_M_next) {
        if (p_Var1[1]._M_prev == (_List_node_base *)sVar8) {
          if (sVar8 == 0) {
            bVar21 = true;
            goto LAB_00123e0e;
          }
          iVar11 = bcmp(p_Var1[1]._M_next,_Var20._M_p,sVar8);
          if (iVar11 == 0) {
            bVar21 = true;
            goto LAB_00123e0e;
          }
        }
      }
      p_Var13 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                _M_create_node<std::__cxx11::string_const&>
                          ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &hostnames,&hname_1);
      std::__detail::_List_node_base::_M_hook(&p_Var13->super__List_node_base);
      hostnames.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size =
           hostnames.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node._M_size + 1;
      iVar10 = iVar10 + 1;
      _Var20 = hname_1._M_dataplus;
    }
LAB_00123e0e:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var20._M_p != &hname_1.field_2) {
      operator_delete(_Var20._M_p,hname_1.field_2._M_allocated_capacity + 1);
    }
    bVar9 = bVar21;
  } while (!bVar21);
LAB_00123d35:
  bVar21 = bVar9;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)hname._M_dataplus._M_p != &hname.field_2) {
    operator_delete(hname._M_dataplus._M_p,hname.field_2._M_allocated_capacity + 1);
  }
  if ((phVar12 == (hostent *)0x0) || (bVar21)) goto LAB_00123e49;
  goto LAB_00123c80;
}

Assistant:

int RTPUDPv6Transmitter::GetLocalHostName(uint8_t *buffer,size_t *bufferlength)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;

	MAINMUTEX_LOCK
	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}

	if (localhostname == 0)
	{
		if (localIPs.empty())
		{
			MAINMUTEX_UNLOCK
			return ERR_RTP_UDPV6TRANS_NOLOCALIPS;
		}
		
		std::list<in6_addr>::const_iterator it;
		std::list<std::string> hostnames;
	
		for (it = localIPs.begin() ; it != localIPs.end() ; it++)
		{
			bool founddouble = false;
			bool foundentry = true;

			while (!founddouble && foundentry)
			{
				struct hostent *he;
				in6_addr ip = (*it);	
			
				he = gethostbyaddr((char *)&ip,sizeof(in6_addr),AF_INET6);
				if (he != 0)
				{
					std::string hname = std::string(he->h_name);
					std::list<std::string>::const_iterator it;

					for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
						if ((*it) == hname)
							founddouble = true;

					if (!founddouble)
						hostnames.push_back(hname);

					int i = 0;
					while (!founddouble && he->h_aliases[i] != 0)
					{
						std::string hname = std::string(he->h_aliases[i]);
						
						for (it = hostnames.begin() ; !founddouble && it != hostnames.end() ; it++)
							if ((*it) == hname)
								founddouble = true;

						if (!founddouble)
						{
							hostnames.push_back(hname);
							i++;
						}
					}
				}
				else
					foundentry = false;
			}
		}
	
		bool found  = false;
		
		if (!hostnames.empty())	// try to select the most appropriate hostname
		{
			std::list<std::string>::const_iterator it;
			
			hostnames.sort();
			for (it = hostnames.begin() ; !found && it != hostnames.end() ; it++)
			{
				if ((*it).find('.') != std::string::npos)
				{
					found = true;
					localhostnamelength = (*it).length();
					localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
					if (localhostname == 0)
					{
						MAINMUTEX_UNLOCK
						return ERR_RTP_OUTOFMEM;
					}
					memcpy(localhostname,(*it).c_str(),localhostnamelength);
					localhostname[localhostnamelength] = 0;
				}
			}
		}
	
		if (!found) // use an IP address
		{
			in6_addr ip;
			int len;
			char str[48];
			uint16_t ip16[8];
			int i,j;
				
			it = localIPs.begin();
			ip = (*it);
			
			for (i = 0,j = 0 ; j < 8 ; j++,i += 2)
			{
				ip16[j] = (((uint16_t)ip.s6_addr[i])<<8);
				ip16[j] |= ((uint16_t)ip.s6_addr[i+1]);
			}			
			
			RTP_SNPRINTF(str,48,"%04X:%04X:%04X:%04X:%04X:%04X:%04X:%04X",(int)ip16[0],(int)ip16[1],(int)ip16[2],(int)ip16[3],(int)ip16[4],(int)ip16[5],(int)ip16[6],(int)ip16[7]);
			len = strlen(str);
	
			localhostnamelength = len;
			localhostname = RTPNew(GetMemoryManager(),RTPMEM_TYPE_OTHER) uint8_t [localhostnamelength+1];
			if (localhostname == 0)
			{
				MAINMUTEX_UNLOCK
				return ERR_RTP_OUTOFMEM;
			}
			memcpy(localhostname,str,localhostnamelength);
			localhostname[localhostnamelength] = 0;
		}
	}
	
	if ((*bufferlength) < localhostnamelength)
	{
		*bufferlength = localhostnamelength; // tell the application the required size of the buffer
		MAINMUTEX_UNLOCK
		return ERR_RTP_TRANS_BUFFERLENGTHTOOSMALL;
	}

	memcpy(buffer,localhostname,localhostnamelength);
	*bufferlength = localhostnamelength;
	
	MAINMUTEX_UNLOCK
	return 0;
}